

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

void HTS_Window_clear(HTS_Window *win)

{
  ulong uVar1;
  
  if (win->coefficient != (double **)0x0) {
    if (win->size != 0) {
      uVar1 = 0;
      do {
        win->coefficient[uVar1] = win->coefficient[uVar1] + win->l_width[uVar1];
        HTS_free(win->coefficient[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < win->size);
    }
    HTS_free(win->coefficient);
  }
  if (win->l_width != (int *)0x0) {
    HTS_free(win->l_width);
  }
  if (win->r_width != (int *)0x0) {
    HTS_free(win->r_width);
  }
  win->r_width = (int *)0x0;
  win->coefficient = (double **)0x0;
  win->size = 0;
  win->l_width = (int *)0x0;
  win->max_width = 0;
  return;
}

Assistant:

static void HTS_Window_clear(HTS_Window * win)
{
   size_t i;

   if (win->coefficient != NULL) {
      for (i = 0; i < win->size; i++) {
         win->coefficient[i] += win->l_width[i];
         HTS_free(win->coefficient[i]);
      }
      HTS_free(win->coefficient);
   }
   if (win->l_width)
      HTS_free(win->l_width);
   if (win->r_width)
      HTS_free(win->r_width);

   HTS_Window_initialize(win);
}